

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int re2::CEscapeString(char *src,int src_len,char *dest,int dest_len)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  pcVar3 = src + src_len;
  iVar2 = 0;
  do {
    if (pcVar3 <= src) {
      iVar4 = -1;
      if (iVar2 < dest_len) {
        dest[iVar2] = '\0';
        iVar4 = iVar2;
      }
      return iVar4;
    }
    if (dest_len - iVar2 < 2) {
      return -1;
    }
    cVar1 = *src;
    if (cVar1 == '\t') {
      (dest + iVar2)[0] = '\\';
      (dest + iVar2)[1] = 't';
LAB_00130484:
      iVar2 = iVar2 + 2;
    }
    else {
      if (cVar1 == '\\') {
        (dest + iVar2)[0] = '\\';
        (dest + iVar2)[1] = '\\';
        goto LAB_00130484;
      }
      if (cVar1 == '\r') {
        (dest + iVar2)[0] = '\\';
        (dest + iVar2)[1] = 'r';
        goto LAB_00130484;
      }
      if (cVar1 == '\"') {
        (dest + iVar2)[0] = '\\';
        (dest + iVar2)[1] = '\"';
        goto LAB_00130484;
      }
      if (cVar1 == '\'') {
        (dest + iVar2)[0] = '\\';
        (dest + iVar2)[1] = '\'';
        goto LAB_00130484;
      }
      if (cVar1 == '\n') {
        (dest + iVar2)[0] = '\\';
        (dest + iVar2)[1] = 'n';
        goto LAB_00130484;
      }
      if ((byte)(cVar1 + 0x81U) < 0xa1) {
        if ((uint)(dest_len - iVar2) < 5) {
          return -1;
        }
        snprintf(dest + iVar2,5,"\\%03o");
        iVar2 = iVar2 + 4;
      }
      else {
        dest[iVar2] = cVar1;
        iVar2 = iVar2 + 1;
      }
    }
    src = src + 1;
  } while( true );
}

Assistant:

int CEscapeString(const char* src, int src_len, char* dest,
                  int dest_len) {
  const char* src_end = src + src_len;
  int used = 0;

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // space for two-character escape
      return -1;

    unsigned char c = *src;
    switch (c) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if (c < ' ' || c > '~') {
          if (dest_len - used < 5)   // space for four-character escape + \0
            return -1;
#if !defined(_WIN32)
          snprintf(dest + used, 5, "\\%03o", c);
#else
          // On Windows, the function takes 4+VA arguments, not 3+VA. With an
          // array, the buffer size will be inferred, but not with a pointer.
          snprintf(dest + used, 5, _TRUNCATE, "\\%03o", c);
#endif
          used += 4;
        } else {
          dest[used++] = c; break;
        }
    }
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}